

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void CEditor::CallbackAppendMap(char *pFileName,int StorageType,void *pUser)

{
  int iVar1;
  long in_RDX;
  CEditor *pEditor;
  CEditor *in_stack_00000078;
  int in_stack_000000a4;
  char *in_stack_000000a8;
  CEditor *in_stack_000000b0;
  
  iVar1 = Append(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4);
  if (iVar1 == 0) {
    SortImages(in_stack_00000078);
  }
  else {
    *(undefined1 *)(in_RDX + 0x49c) = 0;
  }
  *(undefined4 *)(in_RDX + 0x47c) = 0;
  return;
}

Assistant:

void CEditor::CallbackAppendMap(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = (CEditor*)pUser;
	if(pEditor->Append(pFileName, StorageType))
		pEditor->m_aFileName[0] = 0;
	else
		pEditor->SortImages();

	pEditor->m_Dialog = DIALOG_NONE;
}